

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O1

void __thiscall
Omega_h::CmdLineFlag::add_arg<double>(CmdLineFlag *this,string *arg_name,double *defval)

{
  tuple<Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_> this_00;
  pointer *__ptr;
  __uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> local_28;
  
  this_00.super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
  .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>)
       operator_new(0x38);
  CmdLineArg<double>::CmdLineArg
            ((CmdLineArg<double> *)
             this_00.
             super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
             .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl,arg_name,defval);
  local_28._M_t.
  super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>.
  super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl =
       (tuple<Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>)
       (tuple<Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>)
       this_00.
       super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>.
       super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>,std::allocator<std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>>>
  ::emplace_back<std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>>
            ((vector<std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>,std::allocator<std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>>>
              *)&this->args_,
             (unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> *)
             &local_28);
  if ((_Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>)
      local_28._M_t.
      super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>.
      super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl != (CmdLineItem *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                          .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl + 8))()
    ;
  }
  return;
}

Assistant:

void CmdLineFlag::add_arg(std::string const& arg_name, T const& defval) {
  args_.push_back(
      std::unique_ptr<CmdLineArg<T>>(new CmdLineArg<T>(arg_name, defval)));
}